

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O1

void __thiscall spdlog::sinks::base_sink<std::mutex>::flush(base_sink<std::mutex> *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 == 0) {
    (*(this->super_sink)._vptr_sink[7])(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::flush() {
    std::lock_guard<Mutex> lock(mutex_);
    flush_();
}